

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::URIDecode(string *in_uri,string *out_uri,void *user_data)

{
  dlib local_40 [32];
  void *local_20;
  void *user_data_local;
  string *out_uri_local;
  string *in_uri_local;
  
  local_20 = user_data;
  user_data_local = out_uri;
  out_uri_local = in_uri;
  dlib::urldecode(local_40,in_uri);
  std::__cxx11::string::operator=((string *)user_data_local,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return true;
}

Assistant:

bool URIDecode(const std::string &in_uri, std::string *out_uri,
               void *user_data) {
  (void)user_data;
  *out_uri = dlib::urldecode(in_uri);
  return true;
}